

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O0

QList<QPlatformScreen::Mode> * __thiscall QEglFSKmsScreen::modes(QEglFSKmsScreen *this)

{
  bool bVar1;
  const_iterator o;
  _drmModeModeInfo *p_Var2;
  long in_RSI;
  QList<QPlatformScreen::Mode> *in_RDI;
  long in_FS_OFFSET;
  drmModeModeInfo *info;
  add_const_t<const_QList<_drmModeModeInfo>_> *__range1;
  QList<QPlatformScreen::Mode> *list;
  const_iterator __end1;
  const_iterator __begin1;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  QList<QPlatformScreen::Mode> *in_stack_ffffffffffffffa8;
  qsizetype in_stack_ffffffffffffffe8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (Mode *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QList<QPlatformScreen::Mode>::QList((QList<QPlatformScreen::Mode> *)0x10e267);
  QList<_drmModeModeInfo>::size((QList<_drmModeModeInfo> *)(in_RSI + 0x80));
  QList<QPlatformScreen::Mode>::reserve(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffe8);
  local_10.i = (_drmModeModeInfo *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<_drmModeModeInfo>::begin
                       ((QList<_drmModeModeInfo> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  o = QList<_drmModeModeInfo>::end
                ((QList<_drmModeModeInfo> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  while (bVar1 = QList<_drmModeModeInfo>::const_iterator::operator!=(&local_10,o), bVar1) {
    p_Var2 = QList<_drmModeModeInfo>::const_iterator::operator*(&local_10);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    if (p_Var2->vrefresh == 0) {
      in_stack_ffffffffffffff84 = 0x3c;
    }
    else {
      in_stack_ffffffffffffff84 = p_Var2->vrefresh;
    }
    QList<QPlatformScreen::Mode>::append
              ((QList<QPlatformScreen::Mode> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (rvalue_ref)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QList<_drmModeModeInfo>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QPlatformScreen::Mode> QEglFSKmsScreen::modes() const
{
    QList<QPlatformScreen::Mode> list;
    list.reserve(m_output.modes.size());

    for (const drmModeModeInfo &info : std::as_const(m_output.modes))
        list.append({QSize(info.hdisplay, info.vdisplay),
                     qreal(info.vrefresh > 0 ? info.vrefresh : 60)});

    return list;
}